

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void lemon_addtext(char *zBuf,int *pnUsed,char *zIn,int nIn,int iWidth)

{
  int iVar1;
  int in_ECX;
  void *in_RDX;
  int *in_RSI;
  long in_RDI;
  int in_R8D;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  if (in_ECX < 0) {
    for (local_1c = 0; *(char *)((long)in_RDX + (long)local_1c) != '\0'; local_1c = local_1c + 1) {
    }
  }
  for (; local_1c < local_20; local_20 = local_20 + -1) {
    iVar1 = *in_RSI;
    *in_RSI = iVar1 + 1;
    *(undefined1 *)(in_RDI + iVar1) = 0x20;
  }
  if (local_1c != 0) {
    memcpy((void *)(in_RDI + *in_RSI),in_RDX,(long)local_1c);
    *in_RSI = local_1c + *in_RSI;
    for (; local_1c < -local_20; local_20 = local_20 + 1) {
      iVar1 = *in_RSI;
      *in_RSI = iVar1 + 1;
      *(undefined1 *)(in_RDI + iVar1) = 0x20;
    }
    *(undefined1 *)(in_RDI + *in_RSI) = 0;
  }
  return;
}

Assistant:

static void lemon_addtext(
  char *zBuf,           /* The buffer to which text is added */
  int *pnUsed,          /* Slots of the buffer used so far */
  const char *zIn,      /* Text to add */
  int nIn,              /* Bytes of text to add.  -1 to use strlen() */
  int iWidth            /* Field width.  Negative to left justify */
){
  if( nIn<0 ) for(nIn=0; zIn[nIn]; nIn++){}
  while( iWidth>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth--; }
  if( nIn==0 ) return;
  memcpy(&zBuf[*pnUsed], zIn, nIn);
  *pnUsed += nIn;
  while( (-iWidth)>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth++; }
  zBuf[*pnUsed] = 0;
}